

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

_Bool al_fseek(ALLEGRO_FILE *f,int64_t offset,int whence)

{
  _Bool _Var1;
  int iVar2;
  
  if (f->ungetc_len != 0) {
    iVar2 = 0;
    if (whence == 1) {
      iVar2 = f->ungetc_len;
    }
    offset = offset - iVar2;
    f->ungetc_len = 0;
  }
  _Var1 = (*f->vtable->fi_fseek)(f,offset,whence);
  return _Var1;
}

Assistant:

bool al_fseek(ALLEGRO_FILE *f, int64_t offset, int whence)
{
   ASSERT(f);
   /* offset can be negative */
   ASSERT(
      whence == ALLEGRO_SEEK_SET ||
      whence == ALLEGRO_SEEK_CUR ||
      whence == ALLEGRO_SEEK_END
   );

   if (f->ungetc_len) {
      if (whence == ALLEGRO_SEEK_CUR) {
         offset -= f->ungetc_len;
      }
      f->ungetc_len = 0;
   }

   return f->vtable->fi_fseek(f, offset, whence);
}